

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::find_include_once(CTcTokenizer *this,char *fname)

{
  int iVar1;
  long in_RDI;
  char *unaff_retaddr;
  tctok_incfile_t *prvinc;
  undefined8 *local_20;
  
  local_20 = *(undefined8 **)(in_RDI + 0x20);
  while( true ) {
    if (local_20 == (undefined8 *)0x0) {
      return 0;
    }
    iVar1 = os_file_names_equal((char *)prvinc,unaff_retaddr);
    if (iVar1 != 0) break;
    local_20 = (undefined8 *)*local_20;
  }
  return 1;
}

Assistant:

int CTcTokenizer::find_include_once(const char *fname)
{
    tctok_incfile_t *prvinc;

    /* search the list */
    for (prvinc = prev_includes_ ; prvinc != 0 ; prvinc = prvinc->nxt)
    {
        /* if this one matches, we found it, so return true */
        if (os_file_names_equal(fname, prvinc->fname))
            return TRUE;
    }

    /* we didn't find the file */
    return FALSE;
}